

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_arith(lua_State *L,int op)

{
  int iVar1;
  undefined4 uVar2;
  TValue *io1;
  StkId pTVar3;
  
  pTVar3 = L->top;
  if (0xfffffffd < op - 0xeU) {
    iVar1 = pTVar3[-1].tt_;
    uVar2 = *(undefined4 *)&pTVar3[-1].field_0xc;
    pTVar3->value_ = pTVar3[-1].value_;
    pTVar3->tt_ = iVar1;
    *(undefined4 *)&pTVar3->field_0xc = uVar2;
    pTVar3 = L->top + 1;
    L->top = pTVar3;
  }
  luaO_arith(L,op,pTVar3 + -2,pTVar3 + -1,pTVar3 + -2);
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_arith(lua_State *L, int op) {
    lua_lock(L);
    if (op != LUA_OPUNM && op != LUA_OPBNOT)
        api_checknelems(L, 2);  /* all other operations expect two operands */
    else {  /* for unary operations, add fake 2nd operand */
        api_checknelems(L, 1);
        setobjs2s(L, L->top, L->top - 1);
        api_incr_top(L);
    }
    /* first operand at top - 2, second at top - 1; result go to top - 2 */
    luaO_arith(L, op, L->top - 2, L->top - 1, L->top - 2);
    L->top--;  /* remove second operand */
    lua_unlock(L);
}